

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::roll(Forth *this)

{
  uint uVar1;
  uint Value;
  uint x;
  uint n;
  Forth *this_local;
  
  requireDStackDepth(this,1,"ROLL");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  if (uVar1 != 0) {
    requireDStackDepth(this,(ulong)(uVar1 + 1),"ROLL");
    Value = ForthStack<unsigned_int>::getTop(&this->dStack,(ulong)uVar1);
    ForthStack<unsigned_int>::moveStack(&this->dStack,(ulong)uVar1,(ulong)(uVar1 - 1),(ulong)uVar1);
    ForthStack<unsigned_int>::setTop(&this->dStack,Value);
  }
  return;
}

Assistant:

void roll() {
			REQUIRE_DSTACK_DEPTH(1, "ROLL");
			auto n = dStack.getTop(); pop();
			if (n > 0) {
				REQUIRE_DSTACK_DEPTH(n + 1, "ROLL");
				auto x = dStack.getTop(n);
				dStack.moveStack(n, n - 1, n);
				dStack.setTop(x);
			}
		}